

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariter.cpp
# Opt level: O3

void __thiscall
icu_63::CharacterIterator::CharacterIterator
          (CharacterIterator *this,int32_t length,int32_t textBegin,int32_t textEnd,int32_t position
          )

{
  uint uVar1;
  
  (this->super_ForwardCharacterIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CharacterIterator_003e6800;
  this->textLength = length;
  this->pos = position;
  this->begin = textBegin;
  this->end = textEnd;
  if (length < 0) {
    this->textLength = 0;
    length = 0;
  }
  if (textBegin < 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = length;
    if ((uint)textBegin <= (uint)length) goto LAB_00301f31;
  }
  this->begin = uVar1;
  textBegin = uVar1;
LAB_00301f31:
  uVar1 = textBegin;
  if ((textEnd < textBegin) || (uVar1 = length, (uint)length < (uint)textEnd)) {
    this->end = uVar1;
    textEnd = uVar1;
  }
  if ((position < textBegin) || (textBegin = textEnd, (uint)textEnd < (uint)position)) {
    this->pos = textBegin;
  }
  return;
}

Assistant:

CharacterIterator::CharacterIterator(int32_t length, int32_t textBegin, int32_t textEnd, int32_t position)
: textLength(length), pos(position), begin(textBegin), end(textEnd) {
    if(textLength < 0) {
        textLength = 0;
    }
    if(begin < 0) {
        begin = 0;
    } else if(begin > textLength) {
        begin = textLength;
    }
    if(end < begin) {
        end = begin;
    } else if(end > textLength) {
        end = textLength;
    }
    if(pos < begin) {
        pos = begin;
    } else if(pos > end) {
        pos = end;
    }
}